

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_tools.cpp
# Opt level: O3

ON_Mesh * ON_ControlPolygonMesh(ON_NurbsSurface *nurbs_surface,bool bCleanMesh,ON_Mesh *input_mesh)

{
  ON_2dPointArray *this;
  undefined8 *puVar1;
  undefined8 uVar2;
  float fVar3;
  ON_NurbsSurface *this_00;
  char cVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  ON_Mesh *pOVar10;
  ON_SimpleArray<ON_3dPoint> *this_01;
  ON_3dPoint *pOVar11;
  ON_3fVector *pOVar12;
  ON_2dPoint *pOVar13;
  ON_2fPoint *this_02;
  ON_MeshFace *pOVar14;
  int iVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  long lVar17;
  long lVar18;
  double dVar19;
  long lVar20;
  ulong uVar21;
  size_t new_capacity;
  ulong uVar22;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  ON_SimpleArray<double> gv;
  ON_SimpleArray<double> gu;
  ON_Interval d1;
  ON_Interval d0;
  ON_SimpleArray<int> badfi;
  ON_3dPoint V;
  int hint [2];
  ON_2dPoint T;
  ON_3dPoint P [4];
  ON_3dVector N;
  uint local_1f0;
  char local_1eb;
  char local_1ea;
  char local_1e9;
  ON_Mesh *local_1e8;
  char local_1dd;
  uint local_1dc;
  ON_NurbsSurface *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  double local_1b8;
  ON_SimpleArray<double> local_1b0;
  ON_SimpleArray<double> local_198;
  ulong local_180;
  ulong local_178;
  double local_170;
  undefined4 local_164;
  ON_Mesh *local_160;
  ulong local_158;
  ON_SimpleArray<ON_MeshFace> *local_150;
  ON_SimpleArray<ON_2fPoint> *local_148;
  ON_SimpleArray<ON_3fVector> *local_140;
  ON_3dPoint local_138;
  ON_Interval local_120;
  ON_Interval local_110;
  undefined1 local_100 [16];
  int iStack_f0;
  ON_3dPoint local_e8;
  ulong local_d0;
  ulong local_c8;
  int local_c0 [2];
  ON_2dPoint local_b8;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  local_164 = (undefined4)CONCAT71(in_register_00000031,bCleanMesh);
  uVar6 = ON_NurbsSurface::CVCount(nurbs_surface,0);
  dVar19 = (double)(ulong)uVar6;
  uVar7 = ON_NurbsSurface::CVCount(nurbs_surface,1);
  if (nurbs_surface->m_cv != (double *)0x0) {
    iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6]
            )(nurbs_surface);
    if ((char)iVar8 != '\0') {
      local_198._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
      local_198.m_a = (double *)0x0;
      local_198.m_count = 0;
      local_198.m_capacity = 0;
      local_1d8 = nurbs_surface;
      local_160 = input_mesh;
      if (uVar6 != 0) {
        ON_SimpleArray<double>::SetCapacity(&local_198,(long)(int)uVar6);
      }
      local_1b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
      local_1b0.m_a = (double *)0x0;
      local_1b0.m_count = 0;
      local_1b0.m_capacity = 0;
      if (uVar7 != 0) {
        ON_SimpleArray<double>::SetCapacity(&local_1b0,(long)(int)uVar7);
      }
      this_00 = local_1d8;
      if ((-1 < (int)uVar6) && ((int)uVar6 <= local_198.m_capacity)) {
        local_198.m_count = uVar6;
      }
      if ((-1 < (int)uVar7) && ((int)uVar7 <= local_1b0.m_capacity)) {
        local_1b0.m_count = uVar7;
      }
      ON_NurbsSurface::GetGrevilleAbcissae(local_1d8,0,local_198.m_a);
      ON_NurbsSurface::GetGrevilleAbcissae(this_00,1,local_1b0.m_a);
      (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (this_00,0);
      local_110.m_t[0] = extraout_XMM0_Qa;
      local_110.m_t[1] = in_XMM1_Qa;
      (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (this_00,1);
      local_120.m_t[0] = extraout_XMM0_Qa_00;
      local_120.m_t[1] = in_XMM1_Qa;
      iVar8 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x31])
                        (this_00,0);
      local_1ea = '\x01';
      cVar4 = (char)iVar8;
      if (cVar4 == '\0') {
        iVar8 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x30])(this_00,0);
        local_1ea = (char)iVar8;
      }
      iVar8 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x31])
                        (this_00);
      local_1eb = '\x01';
      local_1e9 = (char)iVar8;
      if (local_1e9 == '\0') {
        iVar8 = (*(local_1d8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x30])();
        local_1eb = (char)iVar8;
      }
      uVar16 = 0;
      uVar22 = 0;
      uVar21 = (ulong)uVar7;
      local_1dd = cVar4;
      if (cVar4 != '\0') {
        iVar8 = (*(local_1d8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x2b])();
        uVar6 = (uVar6 - iVar8) + 1;
        local_1b8 = (double)(ulong)uVar6;
        lVar20 = (long)(int)uVar6;
        lVar18 = lVar20 << 0x20;
        local_170 = (double)(lVar20 * 8 + -8);
        local_1c0 = (ulong)uVar7;
        for (uVar22 = 0; iVar8 = ON_NurbsSurface::CVCount(local_1d8,0),
            (long)(lVar20 + uVar22) < (long)iVar8; uVar22 = uVar22 + 1) {
          local_1e8 = (ON_Mesh *)local_198.m_a[uVar22];
          pdVar9 = ON_Interval::operator[](&local_110,0);
          if (*pdVar9 <= (double)local_1e8) break;
          local_1e8 = *(ON_Mesh **)((long)local_198.m_a + uVar22 * 8 + (long)local_170);
          pdVar9 = ON_Interval::operator[](&local_110,1);
          if (*pdVar9 < (double)local_1e8) break;
          lVar18 = lVar18 + 0x100000000;
        }
        ON_Interval::Set(&local_110,local_198.m_a[uVar22],
                         *(double *)((long)local_198.m_a + (lVar18 >> 0x1d) + -8));
        dVar19 = (double)(((ulong)local_1b8 & 0xffffffff) + uVar22);
        uVar21 = local_1c0;
      }
      local_178 = uVar22;
      if (local_1e9 != '\0') {
        iVar8 = (*(local_1d8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x2b])(local_1d8,1);
        uVar6 = ((int)uVar21 - iVar8) + 1;
        local_1c0 = (ulong)uVar6;
        lVar20 = (long)(int)uVar6;
        lVar18 = lVar20 << 0x20;
        local_1b8 = dVar19;
        for (uVar16 = 0; iVar8 = ON_NurbsSurface::CVCount(local_1d8,1),
            (long)(uVar16 + lVar20) < (long)iVar8; uVar16 = uVar16 + 1) {
          local_1e8 = (ON_Mesh *)local_1b0.m_a[uVar16];
          pdVar9 = ON_Interval::operator[](&local_120,0);
          if (*pdVar9 <= (double)local_1e8) break;
          local_1e8 = (ON_Mesh *)local_1b0.m_a[lVar20 + (uVar16 - 1)];
          pdVar9 = ON_Interval::operator[](&local_120,1);
          if (*pdVar9 < (double)local_1e8) break;
          lVar18 = lVar18 + 0x100000000;
        }
        ON_Interval::Set(&local_120,local_1b0.m_a[uVar16],
                         *(double *)((long)local_1b0.m_a + (lVar18 >> 0x1d) + -8));
        uVar21 = (local_1c0 & 0xffffffff) + uVar16;
        dVar19 = local_1b8;
      }
      pOVar10 = local_160;
      if (local_160 == (ON_Mesh *)0x0) {
        pOVar10 = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh::ON_Mesh(pOVar10);
      }
      local_1e8 = pOVar10;
      this_01 = &ON_Mesh::DoublePrecisionVertices(pOVar10)->super_ON_SimpleArray<ON_3dPoint>;
      iVar8 = SUB84(dVar19,0);
      local_1d0 = (ulong)(uint)(iVar8 - (int)local_178);
      local_1dc = (int)uVar21 - (int)uVar16;
      local_180 = (ulong)local_1dc;
      local_1dc = local_1dc * (iVar8 - (int)local_178);
      new_capacity = (size_t)(int)local_1dc;
      if ((uint)this_01->m_capacity < local_1dc) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity(this_01,new_capacity);
      }
      local_140 = &(local_1e8->m_N).super_ON_SimpleArray<ON_3fVector>;
      if ((uint)(local_1e8->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_3fVector>::SetCapacity(local_140,new_capacity);
      }
      local_148 = &(local_1e8->m_T).super_ON_SimpleArray<ON_2fPoint>;
      if ((uint)(local_1e8->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity(local_148,new_capacity);
      }
      this = &local_1e8->m_S;
      if ((uint)(local_1e8->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&this->super_ON_SimpleArray<ON_2dPoint>,new_capacity);
      }
      uVar7 = (int)local_1d0 - 1;
      local_158 = (ulong)uVar7;
      uVar6 = (int)local_180 - 1;
      local_1c8 = (ulong)uVar6;
      uVar6 = uVar6 * uVar7;
      local_150 = &local_1e8->m_F;
      if ((uint)(local_1e8->m_F).m_capacity < uVar6) {
        ON_SimpleArray<ON_MeshFace>::SetCapacity(local_150,(long)(int)uVar6);
      }
      *(double *)&local_1e8->field_0x240 = local_110.m_t[0];
      *(double *)&local_1e8->field_0x248 = local_110.m_t[1];
      *(double *)&local_1e8->field_0x250 = local_120.m_t[0];
      *(double *)&local_1e8->field_0x258 = local_120.m_t[1];
      local_c0[0] = 0;
      local_c0[1] = 0;
      if ((int)uVar16 < (int)uVar21) {
        uVar22 = uVar16 & 0xffffffff;
        local_d0 = uVar21 & 0xffffffff;
        iVar15 = -1;
        local_1c0 = uVar21;
        local_c8 = uVar22;
        do {
          local_1b8 = local_1b0.m_a[uVar22];
          local_b8.y = ON_Interval::NormalizedParameterAt(&local_120,local_1b8);
          local_1f0 = (uint)local_178;
          if ((int)local_1f0 < iVar8) {
            uVar16 = local_178 & 0xffffffff;
            do {
              ON_NurbsSurface::GetCV(local_1d8,(int)uVar16,(int)uVar22,&local_e8);
              local_170 = local_198.m_a[(int)local_1f0];
              local_b8.x = ON_Interval::NormalizedParameterAt(&local_110,local_170);
              ON_Surface::EvNormal
                        (&local_1d8->super_ON_Surface,local_198.m_a[(int)local_1f0],
                         local_1b0.m_a[uVar22],&local_48,0,local_c0);
              pOVar11 = ON_SimpleArray<ON_3dPoint>::AppendNew(this_01);
              pOVar11->z = local_e8.z;
              pOVar11->x = local_e8.x;
              pOVar11->y = local_e8.y;
              pOVar12 = ON_SimpleArray<ON_3fVector>::AppendNew(local_140);
              ON_3fVector::operator=(pOVar12,&local_48);
              pOVar13 = ON_SimpleArray<ON_2dPoint>::AppendNew
                                  (&this->super_ON_SimpleArray<ON_2dPoint>);
              pOVar13->x = local_170;
              pOVar13->y = local_1b8;
              this_02 = ON_SimpleArray<ON_2fPoint>::AppendNew(local_148);
              ON_2fPoint::operator=(this_02,&local_b8);
              if (((int)local_178 < (int)local_1f0) && (local_c8 < uVar22)) {
                pOVar14 = ON_SimpleArray<ON_MeshFace>::AppendNew(local_150);
                pOVar14->vi[0] = iVar15;
                iVar15 = iVar15 + 1;
                pOVar14->vi[1] = iVar15;
                *(ulong *)(pOVar14->vi + 2) = CONCAT44(this_01->m_count + -2,this_01->m_count + -1);
              }
              local_1f0 = local_1f0 + 1;
              uVar16 = (ulong)local_1f0;
            } while ((int)local_1f0 < iVar8);
          }
          iVar15 = iVar15 + 1;
          uVar22 = uVar22 + 1;
          uVar16 = local_1c0;
        } while (uVar22 != local_d0);
      }
      pOVar10 = local_1e8;
      ON_Mesh::UpdateSinglePrecisionVertices(local_1e8);
      cVar4 = local_1e9;
      if (local_1ea != '\0') {
        local_1f0 = 0;
        uVar21 = 0;
        uVar16 = uVar21;
        if (0 < (int)local_180) {
          uVar22 = local_180 & 0xffffffff;
          do {
            iVar8 = (int)uVar21;
            ON_Mesh::Vertex(&local_a8,pOVar10,iVar8);
            iVar15 = (int)local_158 + iVar8;
            ON_Mesh::SetVertex(pOVar10,iVar15,&local_a8);
            if (local_1dd != '\0') {
              pOVar12 = (pOVar10->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              pOVar12[iVar15].z = pOVar12[(int)local_1f0].z;
              fVar3 = pOVar12[(int)local_1f0].y;
              pOVar12[iVar15].x = pOVar12[(int)local_1f0].x;
              pOVar12[iVar15].y = fVar3;
            }
            local_1f0 = iVar8 + (int)local_1d0;
            uVar21 = (ulong)local_1f0;
            uVar6 = (int)uVar22 - 1;
            uVar22 = (ulong)uVar6;
            uVar16 = local_180;
          } while (uVar6 != 0);
        }
      }
      if (local_1eb == '\0') {
        local_1c8 = (ulong)(uint)((int)local_1c8 * (int)local_1d0);
      }
      else {
        local_1f0 = 0;
        uVar6 = (int)local_1c8 * (int)local_1d0;
        local_1c8 = (ulong)uVar6;
        if (0 < (int)local_1d0) {
          lVar18 = (long)(int)uVar6 * 0xc;
          do {
            ON_Mesh::Vertex(&local_a8,pOVar10,local_1f0);
            ON_Mesh::SetVertex(pOVar10,uVar6,&local_a8);
            if (cVar4 != '\0') {
              pOVar12 = (pOVar10->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              *(float *)((long)&pOVar12->z + lVar18) = pOVar12[(int)local_1f0].z;
              *(undefined8 *)((long)&pOVar12->x + lVar18) =
                   *(undefined8 *)(pOVar12 + (int)local_1f0);
            }
            local_1f0 = local_1f0 + 1;
            uVar6 = uVar6 + 1;
            lVar18 = lVar18 + 0xc;
          } while ((int)local_1f0 < (int)local_1d0);
        }
      }
      local_1f0 = 0;
      iVar8 = (int)local_1c8;
      uVar21 = 0;
      do {
        uVar6 = (uint)uVar21;
        iVar15 = (*(local_1d8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                   [0x32])(local_1d8,uVar21);
        if ((char)iVar15 != '\0') {
          switch(uVar21) {
          case 0:
            local_1f0 = 0;
            uVar16 = 1;
            uVar6 = (uint)local_1d0;
            break;
          case 1:
            local_1f0 = (uint)local_158;
            uVar16 = local_1d0;
            uVar6 = local_1dc;
            break;
          case 2:
            local_1f0 = (uint)local_1c8;
            uVar16 = 1;
            uVar6 = local_1dc;
            break;
          case 3:
            local_1f0 = 0;
            uVar16 = local_1d0;
            uVar6 = iVar8 + 1;
          }
          ON_Mesh::Vertex(&local_a8,local_1e8,local_1f0);
          local_e8.z = local_a8.z;
          local_e8.x = local_a8.x;
          local_e8.y = local_a8.y;
          while (local_1f0 = local_1f0 + (int)uVar16, (int)local_1f0 < (int)uVar6) {
            ON_Mesh::SetVertex(local_1e8,local_1f0,&local_e8);
          }
        }
        pOVar10 = local_1e8;
        uVar21 = (ulong)(uVar6 + 1);
      } while ((int)uVar6 < 3);
      if ((char)local_164 != '\0') {
        local_100._0_8_ = &PTR__ON_SimpleArray_00808cb8;
        stack0xffffffffffffff08 = (undefined1  [16])0x0;
        ON_SimpleArray<int>::SetCapacity((ON_SimpleArray<int> *)local_100,0x20);
        local_1f0 = 0;
        iVar8 = (pOVar10->m_F).m_count;
        if (0 < iVar8) {
          do {
            pOVar14 = (pOVar10->m_F).m_a;
            lVar18 = (long)(int)local_1f0;
            ON_Mesh::Vertex(&local_138,pOVar10,pOVar14[lVar18].vi[0]);
            pOVar14 = pOVar14 + lVar18;
            local_a8.z = local_138.z;
            local_a8.x = local_138.x;
            local_a8.y = local_138.y;
            ON_Mesh::Vertex(&local_138,pOVar10,pOVar14->vi[1]);
            local_90.z = local_138.z;
            local_90.x = local_138.x;
            local_90.y = local_138.y;
            ON_Mesh::Vertex(&local_138,pOVar10,pOVar14->vi[2]);
            local_78.z = local_138.z;
            local_78.x = local_138.x;
            local_78.y = local_138.y;
            ON_Mesh::Vertex(&local_138,pOVar10,pOVar14->vi[3]);
            local_60.z = local_138.z;
            local_60.x = local_138.x;
            local_60.y = local_138.y;
            bVar5 = ON_3dPoint::operator==(&local_a8,&local_90);
            if (bVar5) {
              *(undefined8 *)(pOVar14->vi + 1) = *(undefined8 *)(pOVar14->vi + 2);
              local_90.z = local_78.z;
              local_90.x = local_78.x;
              local_90.y = local_78.y;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
              local_78.z = local_60.z;
            }
            bVar5 = ON_3dPoint::operator==(&local_90,&local_78);
            if (bVar5) {
              pOVar14->vi[2] = pOVar14->vi[3];
              local_78.z = local_60.z;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
            }
            bVar5 = ON_3dPoint::operator==(&local_78,&local_60);
            if (bVar5) {
              pOVar14->vi[2] = pOVar14->vi[3];
              local_78.z = local_60.z;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
            }
            bVar5 = ON_3dPoint::operator==(&local_60,&local_a8);
            if (bVar5) {
              *(undefined8 *)pOVar14->vi = *(undefined8 *)(pOVar14->vi + 1);
              pOVar14->vi[2] = pOVar14->vi[3];
              local_a8.z = local_90.z;
              local_a8.x = local_90.x;
              local_a8.y = local_90.y;
              local_90.z = local_78.z;
              local_90.x = local_78.x;
              local_90.y = local_78.y;
              local_78.z = local_60.z;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
            }
            if ((((pOVar14->vi[0] == pOVar14->vi[1]) || (pOVar14->vi[1] == pOVar14->vi[2])) ||
                (pOVar14->vi[3] == pOVar14->vi[0])) ||
               ((bVar5 = ON_3dPoint::operator==(&local_a8,&local_78), bVar5 ||
                (bVar5 = ON_3dPoint::operator==(&local_90,&local_60), bVar5)))) {
              ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_100,(int *)&local_1f0);
            }
            local_1f0 = local_1f0 + 1;
            iVar8 = (local_1e8->m_F).m_count;
            pOVar10 = local_1e8;
          } while ((int)local_1f0 < iVar8);
        }
        pOVar10 = local_1e8;
        if (0 < iStack_f0) {
          if (iStack_f0 == iVar8) {
            if (local_160 == (ON_Mesh *)0x0) {
              (*(local_1e8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(local_1e8);
            }
            else {
              ON_Mesh::Destroy(local_1e8);
            }
            pOVar10 = (ON_Mesh *)0x0;
          }
          else {
            uVar6 = *(uint *)local_100._8_8_;
            local_1f0 = uVar6;
            if ((int)(uVar6 + 1) < iVar8) {
              lVar18 = (long)(int)uVar6 + 1;
              iVar15 = 1;
              lVar20 = (long)(int)uVar6 << 4;
              do {
                if ((iVar15 < iStack_f0) &&
                   ((uint)lVar18 == *(uint *)(local_100._8_8_ + (long)iVar15 * 4))) {
                  iVar15 = iVar15 + 1;
                }
                else {
                  pOVar14 = (local_1e8->m_F).m_a;
                  lVar17 = (long)(int)uVar6;
                  uVar6 = uVar6 + 1;
                  puVar1 = (undefined8 *)((long)pOVar14[1].vi + lVar20);
                  uVar2 = puVar1[1];
                  pOVar14 = pOVar14 + lVar17;
                  *(undefined8 *)pOVar14->vi = *puVar1;
                  *(undefined8 *)(pOVar14->vi + 2) = uVar2;
                  iVar8 = (local_1e8->m_F).m_count;
                  local_1f0 = uVar6;
                }
                lVar18 = lVar18 + 1;
                lVar20 = lVar20 + 0x10;
              } while (lVar18 < iVar8);
            }
            if ((-1 < (int)uVar6) && ((int)uVar6 <= (local_1e8->m_F).m_capacity)) {
              (local_1e8->m_F).m_count = uVar6;
            }
            ON_Mesh::CullUnusedVertices(local_1e8);
          }
        }
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_100);
      }
      ON_SimpleArray<double>::~ON_SimpleArray(&local_1b0);
      ON_SimpleArray<double>::~ON_SimpleArray(&local_198);
      return pOVar10;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_tools.cpp"
             ,0x355,"","ON_ControlPolygonMesh - surface is not valid");
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_ControlPolygonMesh(
  const ON_NurbsSurface& nurbs_surface,
  bool bCleanMesh,
  ON_Mesh* input_mesh
)
{
  int u0 = 0;
  int u1 = nurbs_surface.CVCount(0);

  int v0 = 0;
  int v1 = nurbs_surface.CVCount(1);

  if ( 0 == nurbs_surface.m_cv || !nurbs_surface.IsValid() )
  {
    ON_ERROR("ON_ControlPolygonMesh - surface is not valid");
    return nullptr;
  }

  ON_SimpleArray<double> gu(u1);
  ON_SimpleArray<double> gv(v1);
  gu.SetCount(u1);
  gv.SetCount(v1);
  nurbs_surface.GetGrevilleAbcissae(0,gu.Array());
  nurbs_surface.GetGrevilleAbcissae(1,gv.Array());

  ON_Interval d0 = nurbs_surface.Domain(0);
  ON_Interval d1 = nurbs_surface.Domain(1);

  bool bPeriodic0 = nurbs_surface.IsPeriodic(0)?true:false;
  bool bIsClosed0 = bPeriodic0 ? true : (nurbs_surface.IsClosed(0)?true:false);
  bool bPeriodic1 = nurbs_surface.IsPeriodic(1)?true:false;
  bool bIsClosed1 = bPeriodic1 ? true : (nurbs_surface.IsClosed(1)?true:false);

  if ( bPeriodic0 )
  {
    u1 -= (nurbs_surface.Degree(0) - 1);
    while ( u1 < nurbs_surface.CVCount(0) && gu[u0] < d0[0] && gu[u1-1] <= d0[1] )
    {
      u0++;
      u1++;
    }
    d0.Set(gu[u0],gu[u1-1]);
  }

  if ( bPeriodic1 )
  {
    v1 -= (nurbs_surface.Degree(1) - 1);
    while ( v1 < nurbs_surface.CVCount(1) && gv[v0] < d1[0] && gv[v1-1] <= d1[1] )
    {
      v0++;
      v1++;
    }
    d1.Set(gv[v0],gv[v1-1]);
  }


  ON_Mesh* mesh = (0 == input_mesh) ? new ON_Mesh() : input_mesh;

  int vertex_count = (u1-u0)*(v1-v0);
  int face_count = (u1-u0-1)*(v1-v0-1);

  ON_3dPointArray& dpv = mesh->DoublePrecisionVertices();
  dpv.Reserve(vertex_count);
  mesh->m_N.Reserve(vertex_count);
  mesh->m_T.Reserve(vertex_count);
  mesh->m_S.Reserve(vertex_count);
  mesh->m_F.Reserve(face_count);
  mesh->m_srf_domain[0] = d0;
  mesh->m_srf_domain[1] = d1;

  ON_3dPoint V;
  ON_3dVector N;
  ON_2dPoint S;
  ON_2dPoint T;

  int hint[2] = {0,0};
  int i, j;
  int k = -1;
  for ( j = v0; j < v1; j++)
  {
    S.y = gv[j];
    T.y = d1.NormalizedParameterAt(S.y);
    for ( i = u0; i < u1; i++)
    {
      nurbs_surface.GetCV( i, j, V);
      S.x = gu[i];
      T.x = d0.NormalizedParameterAt(S.x);
      nurbs_surface.EvNormal(gu[i],gv[j],N,0,hint);
      dpv.AppendNew() = V;
      mesh->m_N.AppendNew() = N;
      mesh->m_S.AppendNew() = S;
      mesh->m_T.AppendNew() = T;
      if ( i > u0 && j > v0 )
      {
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = k++;
        f.vi[1] = k;
        f.vi[2] = dpv.Count()-1;
        f.vi[3] = f.vi[2]-1;
      }
    }
    k++;
  }
  
  mesh->UpdateSinglePrecisionVertices();

  u1 -= u0;
  v1 -= v0;

  // make sure closed seams are spot on
  if ( bIsClosed0 )
  {
    i = 0;
    for ( j = 0; j < v1; j++ )
    {
      k = i + (u1-1);
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic0 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      i = k+1;
      // do NOT synch texture coordinates
    }
  }

  if ( bIsClosed1 )
  {
    for ( i = 0, k = u1*(v1-1); i < u1; i++, k++ )
    {
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic1 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      // do NOT synch texture coordinates
    }
  }

  // make sure singular ends are spot on
  i=0;
  for ( k = 0; k < 4; k++ )
  {
    if ( nurbs_surface.IsSingular(k) )
    {
      switch(k)
      {
      case 0: // 0 = south
        i = 0;
        j = 1;
        k = u1;
        break;

      case 1: // 1 = east
        i = u1-1;
        j = u1;
        k = u1*v1;
        break;

      case 2: // 2 = north
        i = u1*(v1-1);
        j = 1;
        k = u1*v1;
        break;

      case 3: // 3 = west
        i = 0;
        j = u1;
        k = u1*(v1-1)+1;
        break;
      }
      V = mesh->Vertex(i);
      for ( i = i+j; i < k; i += j )
      {
        mesh->SetVertex(i, V);
      }
    }
  }

  if ( bCleanMesh )
  {
    // Clean up triangles etc.
    ON_3dPoint P[4];
    ON_SimpleArray<int> badfi(32);
    for ( i = 0; i < mesh->m_F.Count(); i++ )
    {
      ON_MeshFace& f = mesh->m_F[i];
      P[0] = mesh->Vertex(f.vi[0]);
      P[1] = mesh->Vertex(f.vi[1]);
      P[2] = mesh->Vertex(f.vi[2]);
      P[3] = mesh->Vertex(f.vi[3]);
      if ( P[0] == P[1] )
      {
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[1] = P[2];
        P[2] = P[3];
      }
      if ( P[1] == P[2] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[2] == P[3] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[3] == P[0] )
      {
        f.vi[0] = f.vi[1];
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[0] = P[1];
        P[1] = P[2];
        P[2] = P[3];
      }
      if (    f.vi[0] == f.vi[1] 
           || f.vi[1] == f.vi[2] 
           || f.vi[3] == f.vi[0] 
           || P[0] == P[2] || P[1] == P[3] )
      {
        badfi.Append(i);
      }
    }
    
    if ( badfi.Count() > 0 )
    {
      if ( badfi.Count() == mesh->m_F.Count() )
      {
        if ( input_mesh )
        {
          mesh->Destroy();
        }
        else
        {
          delete mesh;
        }
        mesh = 0;
      }
      else
      {
        // remove bad faces
        i = badfi[0];
        j = i+1;
        k = 1;
        for ( j = i+1; j < mesh->m_F.Count(); j++ )
        {
          if ( k < badfi.Count() && j == badfi[k] )
          {
            k++;
          }
          else
          {
            mesh->m_F[i++] = mesh->m_F[j];
          }
        }
        mesh->m_F.SetCount(i);
      }

      // 29 May 2008: Mikko, TRR 34687:
      // Added crash protection. At this point mesh is nullptr if it contained all bad faces.
      if ( mesh)
        mesh->CullUnusedVertices();
    }
  }

  return mesh;
}